

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# start.c
# Opt level: O0

int main(int argc,char **argv)

{
  undefined8 uVar1;
  undefined8 uVar2;
  FILE *__stream;
  size_t sVar3;
  ulong local_90;
  size_t i;
  wasm_frame_vec_t trace;
  wasm_frame_t *frame;
  wasm_name_t message;
  wasm_instance_t *instance;
  wasm_trap_t *trap;
  wasm_module_t *module;
  wasm_byte_vec_t binary;
  size_t file_size;
  FILE *file;
  wasm_store_t *store;
  wasm_engine_t *engine;
  char **argv_local;
  int argc_local;
  
  printf("Initializing...\n");
  uVar1 = wasm_engine_new();
  uVar2 = wasm_store_new(uVar1);
  printf("Loading binary...\n");
  __stream = fopen("start.wasm","r");
  if (__stream == (FILE *)0x0) {
    printf("> Error loading module!\n");
    argv_local._4_4_ = 1;
  }
  else {
    fseek(__stream,0,2);
    binary.data = (wasm_byte_t *)ftell(__stream);
    fseek(__stream,0,0);
    wasm_byte_vec_new_uninitialized(&module,binary.data);
    sVar3 = fread((void *)binary.size,(size_t)binary.data,1,__stream);
    if (sVar3 == 1) {
      fclose(__stream);
      printf("Compiling module...\n");
      trap = (wasm_trap_t *)wasm_module_new(uVar2,&module);
      if (trap == (wasm_trap_t *)0x0) {
        printf("> Error compiling module!\n");
        argv_local._4_4_ = 1;
      }
      else {
        wasm_byte_vec_delete(&module);
        printf("Instantiating module...\n");
        instance = (wasm_instance_t *)0x0;
        message.data = (wasm_byte_t *)wasm_instance_new(uVar2,trap,0,&instance);
        if ((message.data == (wasm_byte_t *)0x0) && (instance != (wasm_instance_t *)0x0)) {
          wasm_module_delete(trap);
          printf("Printing message...\n");
          wasm_trap_message(instance,&frame);
          printf("> %s\n",message.size);
          printf("Printing origin...\n");
          trace.data = (wasm_frame_t **)wasm_trap_origin(instance);
          if ((wasm_frame_t *)trace.data == (wasm_frame_t *)0x0) {
            printf("> Empty origin.\n");
          }
          else {
            print_frame((wasm_frame_t *)trace.data);
            wasm_frame_delete(trace.data);
          }
          printf("Printing trace...\n");
          wasm_trap_trace(instance,&i);
          if (i == 0) {
            printf("> Empty trace.\n");
          }
          else {
            for (local_90 = 0; local_90 < i; local_90 = local_90 + 1) {
              print_frame(*(wasm_frame_t **)(trace.size + local_90 * 8));
            }
          }
          wasm_frame_vec_delete(&i);
          wasm_trap_delete(instance);
          wasm_byte_vec_delete(&frame);
          printf("Shutting down...\n");
          wasm_store_delete(uVar2);
          wasm_engine_delete(uVar1);
          printf("Done.\n");
          argv_local._4_4_ = 0;
        }
        else {
          printf("> Error instantiating module, expected trap!\n");
          argv_local._4_4_ = 1;
        }
      }
    }
    else {
      printf("> Error loading module!\n");
      argv_local._4_4_ = 1;
    }
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, const char* argv[]) {
  // Initialize.
  printf("Initializing...\n");
  wasm_engine_t* engine = wasm_engine_new();
  wasm_store_t* store = wasm_store_new(engine);

  // Load binary.
  printf("Loading binary...\n");
  FILE* file = fopen("start.wasm", "r");
  if (!file) {
    printf("> Error loading module!\n");
    return 1;
  }
  fseek(file, 0L, SEEK_END);
  size_t file_size = ftell(file);
  fseek(file, 0L, SEEK_SET);
  wasm_byte_vec_t binary;
  wasm_byte_vec_new_uninitialized(&binary, file_size);
  if (fread(binary.data, file_size, 1, file) != 1) {
    printf("> Error loading module!\n");
    return 1;
  }
  fclose(file);

  // Compile.
  printf("Compiling module...\n");
  own wasm_module_t* module = wasm_module_new(store, &binary);
  if (!module) {
    printf("> Error compiling module!\n");
    return 1;
  }

  wasm_byte_vec_delete(&binary);

  // Instantiate.
  printf("Instantiating module...\n");
  own wasm_trap_t* trap = NULL;
  own wasm_instance_t* instance =
    wasm_instance_new(store, module, NULL, &trap);
  if (instance || !trap) {
    printf("> Error instantiating module, expected trap!\n");
    return 1;
  }

  wasm_module_delete(module);

  // Print result.
  printf("Printing message...\n");
  own wasm_name_t message;
  wasm_trap_message(trap, &message);
  printf("> %s\n", message.data);

  printf("Printing origin...\n");
  own wasm_frame_t* frame = wasm_trap_origin(trap);
  if (frame) {
    print_frame(frame);
    wasm_frame_delete(frame);
  } else {
    printf("> Empty origin.\n");
  }

  printf("Printing trace...\n");
  own wasm_frame_vec_t trace;
  wasm_trap_trace(trap, &trace);
  if (trace.size > 0) {
    for (size_t i = 0; i < trace.size; ++i) {
      print_frame(trace.data[i]);
    }
  } else {
    printf("> Empty trace.\n");
  }

  wasm_frame_vec_delete(&trace);
  wasm_trap_delete(trap);
  wasm_name_delete(&message);

  // Shut down.
  printf("Shutting down...\n");
  wasm_store_delete(store);
  wasm_engine_delete(engine);

  // All done.
  printf("Done.\n");
  return 0;
}